

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx512::forward
          (Yolov3DetectionOutput_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar2;
  ulong uVar3;
  pointer pMVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  iterator __position;
  Mat *this_01;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar16;
  int iVar17;
  undefined8 uVar18;
  undefined4 *puVar19;
  int iVar20;
  float *pfVar21;
  ulong uVar22;
  BBoxRect *__args;
  long lVar23;
  long lVar24;
  float *pfVar25;
  int iVar26;
  int iVar27;
  uint _h;
  float *pfVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  float fVar33;
  float fVar34;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 extraout_var [60];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined8 uVar49;
  undefined1 auVar50 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1b8;
  long local_1a0;
  BBoxRect local_198;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_178;
  undefined1 local_158 [16];
  ulong local_148;
  pointer local_140;
  ulong local_138;
  long local_130;
  uint *local_128;
  float *local_120;
  float *local_118;
  Yolov3DetectionOutput *local_110;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_108;
  Option *local_100;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f8;
  long local_f0;
  long local_e8;
  void *local_e0;
  ulong local_d8;
  float *local_d0;
  undefined8 local_c8;
  void *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined1 local_58 [32];
  undefined1 auVar42 [16];
  
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = top_blobs;
  local_100 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar22 = 0;
    local_110 = &this->super_Yolov3DetectionOutput;
    local_f8 = bottom_blobs;
    do {
      pvVar16 = local_f8;
      local_1b8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_1b8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1b8,(long)(this->super_Yolov3DetectionOutput).num_box);
      pMVar4 = (pvVar16->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = pMVar4[uVar22].c / (this->super_Yolov3DetectionOutput).num_box;
      if (iVar17 != (this->super_Yolov3DetectionOutput).num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1b8);
        iVar17 = -1;
        goto LAB_00484762;
      }
      local_148 = uVar22;
      if (0 < (this->super_Yolov3DetectionOutput).num_box) {
        local_140 = pMVar4 + uVar22;
        uVar3._0_4_ = local_140->w;
        uVar3._4_4_ = local_140->h;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar3;
        auVar31 = vcvtdq2ps_avx(auVar31);
        uVar2 = *(undefined4 *)
                 ((long)(this->super_Yolov3DetectionOutput).anchors_scale.data + uVar22 * 4);
        auVar29._4_4_ = uVar2;
        auVar29._0_4_ = uVar2;
        auVar29._8_4_ = uVar2;
        auVar29._12_4_ = uVar2;
        auVar29 = vmulps_avx512vl(auVar31,auVar29);
        local_138 = uVar3 >> 0x20;
        lVar23 = CONCAT44((int)(uVar22 * 9 >> 0x20),(undefined4)uVar3);
        local_b8 = vroundps_avx(auVar29,0xb);
        local_f0 = (long)iVar17;
        auVar30._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar30._12_4_ = 0x3f000000;
        local_98 = auVar31._0_8_;
        register0x00001248 = auVar30._8_8_;
        auVar35._8_4_ = 0x3f800000;
        auVar35._0_8_ = 0x3f8000003f800000;
        auVar35._12_4_ = 0x3f800000;
        _local_a8 = vdivps_avx(auVar35,_local_98);
        local_e8 = (long)(this->super_Yolov3DetectionOutput).num_box * uVar22 * 4;
        local_1a0 = 0;
        local_130 = lVar23;
        do {
          uVar22 = local_140->elemsize;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar22;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = (long)local_140->d * uVar22 * (long)local_140->h * (long)local_140->w + 0xf
                         & 0xfffffffffffffff0;
          uVar18 = SUB168(auVar9 / auVar8,0);
          if (0 < (int)local_138) {
            lVar24 = local_1a0 * local_f0;
            local_e0 = (void *)((lVar24 + 5) * local_140->cstep * uVar22 + (long)local_140->data);
            auVar36._8_8_ = 0;
            auVar36._0_8_ =
                 *(ulong *)((long)(this->super_Yolov3DetectionOutput).biases.data +
                           (long)((int)*(float *)((long)(this->super_Yolov3DetectionOutput).mask.
                                                        data + local_1a0 * 4 + local_e8) * 2) * 4);
            auVar30 = vpbroadcastd_avx512vl();
            auVar31 = vpmulld_avx(auVar30,_DAT_005f2df0);
            auVar29 = vpmulld_avx(auVar30,_DAT_005fe140);
            auVar32 = vpexpandd_avx512vl(ZEXT1632(auVar30));
            auVar10 = vpermq_avx2(ZEXT1632(auVar31),0xd0);
            auVar10 = vpblendd_avx2(auVar10,ZEXT432(auVar32._4_4_) << 0x20,3);
            uVar49 = auVar29._0_8_;
            auVar32._8_8_ = uVar49;
            auVar32._0_8_ = uVar49;
            auVar32._16_8_ = uVar49;
            auVar32._24_8_ = uVar49;
            local_58 = vpblendd_avx2(auVar10,auVar32,0xc0);
            sVar5 = local_140->cstep;
            pvVar6 = local_140->data;
            sVar7 = local_140->elemsize;
            pfVar28 = (float *)((lVar24 + 4) * sVar5 * sVar7 + (long)pvVar6);
            local_118 = (float *)((lVar24 + 3) * sVar5 * sVar7 + (long)pvVar6);
            local_120 = (float *)((lVar24 + 2) * sVar5 * sVar7 + (long)pvVar6);
            local_128 = (uint *)((lVar24 + 1) * sVar5 * sVar7 + (long)pvVar6);
            pfVar25 = (float *)(lVar24 * sVar5 * sVar7 + (long)pvVar6);
            iVar17 = SUB164(auVar9 / auVar8,0);
            auVar42._8_4_ = 0x3f800000;
            auVar42._0_8_ = 0x3f8000003f800000;
            auVar42._12_4_ = 0x3f800000;
            auVar45 = ZEXT1664(auVar42);
            local_88 = vmovlhps_avx(auVar42,auVar36);
            uVar22 = 0;
            local_c8 = uVar18;
            do {
              local_d8 = uVar22;
              if (0 < (int)lVar23) {
                auVar37._0_4_ = (float)(int)uVar22;
                local_c0 = (void *)((long)local_e0 + uVar22 * lVar23 * 4);
                auVar37._4_4_ = auVar37._0_4_;
                auVar37._8_4_ = auVar37._0_4_;
                auVar37._12_4_ = auVar37._0_4_;
                local_78 = vunpcklpd_avx(auVar37,local_b8);
                lVar23 = 0;
                do {
                  pfVar1 = (float *)((long)local_c0 + lVar23 * 4);
                  iVar20 = ((this->super_Yolov3DetectionOutput).num_class & 0xfffffff8U) *
                           (int)uVar18;
                  pfVar21 = pfVar1;
                  if (iVar20 < 1) {
                    iVar26 = 0;
                    auVar50 = ZEXT464(0xff7fffff);
                    iVar27 = 0;
                  }
                  else {
                    iVar27 = 0;
                    auVar50 = ZEXT464(0xff7fffff);
                    iVar26 = 0;
                    do {
                      auVar10 = vpcmpeqd_avx2(auVar45._0_32_,auVar45._0_32_);
                      auVar41 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar10);
                      auVar10 = vpermpd_avx2(auVar41,0x4e);
                      auVar10 = vmaxps_avx(auVar41,auVar10);
                      auVar32 = vshufpd_avx(auVar10,auVar10,5);
                      auVar10 = vmaxps_avx(auVar10,auVar32);
                      auVar32 = vshufps_avx(auVar10,auVar10,0xb1);
                      auVar10 = vmaxps_avx(auVar10,auVar32);
                      auVar45 = ZEXT3264(auVar10);
                      if (auVar50._0_4_ < auVar10._0_4_) {
                        uVar49 = vcmpps_avx512vl(auVar41,auVar10,0);
                        iVar27 = 0;
                        if ((uint)uVar49 != 0) {
                          for (; ((uint)uVar49 >> iVar27 & 1) == 0; iVar27 = iVar27 + 1) {
                          }
                        }
                        iVar27 = iVar27 + iVar26;
                        auVar50 = ZEXT1664(auVar10._0_16_);
                      }
                      pfVar21 = pfVar21 + iVar17 * 8;
                      iVar26 = iVar26 + 8;
                    } while (pfVar21 < pfVar1 + iVar20);
                  }
                  for (; local_158 = auVar50._0_16_,
                      pfVar21 < pfVar1 + (this->super_Yolov3DetectionOutput).num_class * (int)uVar18
                      ; pfVar21 = pfVar21 + iVar17) {
                    if (auVar50._0_4_ < *pfVar21) {
                      iVar27 = iVar26;
                    }
                    auVar31 = vmaxss_avx(ZEXT416((uint)*pfVar21),local_158);
                    auVar50 = ZEXT1664(auVar31);
                    iVar26 = iVar26 + 1;
                  }
                  fVar33 = expf(-*pfVar28);
                  auVar11._8_4_ = 0x80000000;
                  auVar11._0_8_ = 0x8000000080000000;
                  auVar11._12_4_ = 0x80000000;
                  auVar31 = vxorps_avx512vl(local_158,auVar11);
                  fVar34 = expf(auVar31._0_4_);
                  auVar45 = ZEXT464(0x3f800000);
                  auVar31 = vfmadd132ss_fma(ZEXT416((uint)(fVar34 + 1.0)),auVar45._0_16_,
                                            ZEXT416((uint)fVar33));
                  fVar33 = 1.0 / auVar31._0_4_;
                  if (local_110->confidence_threshold <= fVar33) {
                    local_d0 = pfVar28;
                    fVar34 = expf(-*pfVar25);
                    local_158 = ZEXT416((uint)(fVar34 + 1.0));
                    auVar12._8_4_ = 0x80000000;
                    auVar12._0_8_ = 0x8000000080000000;
                    auVar12._12_4_ = 0x80000000;
                    auVar31 = vxorps_avx512vl(ZEXT416(*local_128),auVar12);
                    fVar34 = expf(auVar31._0_4_);
                    local_158 = vinsertps_avx(local_158,ZEXT416((uint)(fVar34 + 1.0)),0x10);
                    local_68 = expf(*local_120);
                    uStack_64 = extraout_XMM0_Db;
                    auVar45._0_4_ = expf(*local_118);
                    auVar45._4_60_ = extraout_var;
                    auVar43._8_8_ = CONCAT44(uStack_64,local_68);
                    auVar43._0_8_ = CONCAT44(uStack_64,local_68);
                    auVar29 = vinsertps_avx(auVar43,auVar45._0_16_,0x30);
                    auVar31 = vdivps_avx(local_88,local_158);
                    auVar46._0_4_ = (float)(int)lVar23;
                    auVar46._4_12_ = local_78._4_12_;
                    auVar13._4_8_ = auVar29._8_8_;
                    auVar13._0_4_ = local_88._4_4_ * auVar29._4_4_;
                    auVar38._0_8_ = auVar13._0_8_ << 0x20;
                    auVar38._8_4_ = local_88._8_4_ * auVar29._8_4_;
                    auVar38._12_4_ = local_88._12_4_ * auVar29._12_4_;
                    auVar39._8_8_ = auVar38._8_8_;
                    auVar39._0_8_ = auVar31._0_8_;
                    auVar44._0_4_ = (auVar31._0_4_ + auVar46._0_4_) * (float)local_a8._0_4_;
                    auVar44._4_4_ = (auVar31._4_4_ + local_78._4_4_) * (float)local_a8._4_4_;
                    auVar44._8_4_ = (auVar31._8_4_ + local_78._8_4_) * fStack_a0;
                    auVar44._12_4_ = (auVar31._12_4_ + local_78._12_4_) * fStack_9c;
                    auVar31 = vdivps_avx(auVar39,auVar46);
                    auVar47._0_4_ = auVar31._0_4_ * (float)local_98._0_4_;
                    auVar47._4_4_ = auVar31._4_4_ * (float)local_98._4_4_;
                    auVar47._8_4_ = auVar31._8_4_ * fStack_90;
                    auVar47._12_4_ = auVar31._12_4_ * fStack_8c;
                    auVar29 = vshufpd_avx(auVar47,auVar44,1);
                    auVar30 = vsubps_avx(auVar44,auVar29);
                    auVar14._4_8_ = auVar47._8_8_;
                    auVar14._0_4_ = auVar47._4_4_ + auVar29._4_4_;
                    auVar48._0_8_ = auVar14._0_8_ << 0x20;
                    auVar48._8_4_ = auVar47._8_4_ + auVar29._8_4_;
                    auVar48._12_4_ = auVar47._12_4_ + auVar29._12_4_;
                    uVar18 = auVar48._8_8_;
                    auVar45 = ZEXT1664(CONCAT88(uVar18,auVar30._0_8_));
                    auVar29 = vmovshdup_avx(auVar31);
                    auVar40._0_4_ = auVar29._0_4_ * auVar31._0_4_;
                    auVar40._4_4_ = auVar29._4_4_ * auVar31._4_4_;
                    auVar40._8_4_ = auVar29._8_4_ * auVar31._8_4_;
                    auVar40._12_4_ = auVar29._12_4_ * auVar31._12_4_;
                    local_198.xmin = auVar30._0_4_;
                    local_198.ymin = auVar30._4_4_;
                    local_198.area = (float)vextractps_avx(auVar40,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1b8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1a0);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_198.score = fVar33;
                    local_198.xmax = auVar48._8_4_;
                    local_198.ymax = auVar48._12_4_;
                    local_198.label = iVar27;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_198);
                      pfVar28 = local_d0;
                    }
                    else {
                      auVar15._8_4_ = local_198.area;
                      auVar15._0_8_ = uVar18;
                      auVar15._12_4_ = iVar27;
                      auVar45 = ZEXT1664(auVar15);
                      (__position._M_current)->xmax = (float)(int)uVar18;
                      (__position._M_current)->ymax = (float)(int)((ulong)uVar18 >> 0x20);
                      (__position._M_current)->area = local_198.area;
                      (__position._M_current)->label = iVar27;
                      (__position._M_current)->score = fVar33;
                      (__position._M_current)->xmin = local_198.xmin;
                      (__position._M_current)->ymin = local_198.ymin;
                      (__position._M_current)->xmax = auVar48._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar28 = local_d0;
                    }
                  }
                  pfVar25 = pfVar25 + 1;
                  local_128 = local_128 + 1;
                  local_120 = local_120 + 1;
                  local_118 = local_118 + 1;
                  pfVar28 = pfVar28 + 1;
                  lVar23 = lVar23 + 1;
                  uVar18 = local_c8;
                  this = (Yolov3DetectionOutput_x86_avx512 *)local_110;
                } while (lVar23 != local_130);
              }
              uVar22 = local_d8 + 1;
              lVar23 = local_130;
            } while (uVar22 != local_138);
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 < (this->super_Yolov3DetectionOutput).num_box);
      }
      if (0 < (this->super_Yolov3DetectionOutput).num_box) {
        lVar23 = 8;
        lVar24 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_178,
                     local_178.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1b8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8),
                     *(undefined8 *)
                      ((long)&((local_1b8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar23));
          lVar24 = lVar24 + 1;
          lVar23 = lVar23 + 0x18;
        } while (lVar24 < (this->super_Yolov3DetectionOutput).num_box);
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1b8);
      uVar22 = local_148 + 1;
    } while (uVar22 < (ulong)(((long)(local_f8->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_f8->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace(&this->super_Yolov3DetectionOutput,&local_178);
  local_198.score = 0.0;
  local_198.xmin = 0.0;
  local_198.ymin = 0.0;
  local_198.xmax = 0.0;
  local_198.ymax = 0.0;
  local_198.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            (&this->super_Yolov3DetectionOutput,&local_178,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198,
             (this->super_Yolov3DetectionOutput).nms_threshold);
  local_1b8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_1b8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar23 = CONCAT44(local_198.xmin,local_198.score);
  if (CONCAT44(local_198.xmax,local_198.ymin) != lVar23) {
    uVar22 = 0;
    do {
      __args = local_178.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar23 + uVar22 * 8);
      if (local_1b8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1b8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1b8,
                   (iterator)
                   local_1b8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar18 = *(undefined8 *)__args;
        uVar49 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1b8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1b8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar18;
        *(undefined8 *)
         ((long)local_1b8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar49;
        local_1b8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1b8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar22 = uVar22 + 1;
      lVar23 = CONCAT44(local_198.xmin,local_198.score);
    } while (uVar22 < (ulong)(CONCAT44(local_198.xmax,local_198.ymin) - lVar23 >> 3));
  }
  _h = (int)((long)local_1b8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1b8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
  iVar17 = 0;
  if (_h != 0) {
    this_01 = (local_108->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,local_100->blob_allocator);
    iVar17 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar17 = 0, 0 < (int)_h)) {
      iVar20 = this_01->w;
      sVar5 = this_01->elemsize;
      puVar19 = (undefined4 *)((long)this_01->data + 0x14);
      iVar17 = 0;
      lVar23 = 0;
      do {
        uVar2 = *(undefined4 *)
                 ((long)&((local_1b8.
                           super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar23);
        puVar19[-5] = (float)*(int *)((long)&local_1b8.
                                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar23) +
                      1.0;
        puVar19[-4] = uVar2;
        puVar19[-3] = *(undefined4 *)
                       ((long)&((local_1b8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar23 + 4);
        puVar19[-2] = *(undefined4 *)
                       ((long)&((local_1b8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar23);
        puVar19[-1] = *(undefined4 *)
                       ((long)&((local_1b8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar23 + 4);
        *puVar19 = *(undefined4 *)
                    ((long)&((local_1b8.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar23);
        lVar23 = lVar23 + 0x1c;
        puVar19 = (undefined4 *)((long)puVar19 + (long)iVar20 * sVar5);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar23);
    }
  }
  if (local_1b8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar6 = (void *)CONCAT44(local_198.xmin,local_198.score);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,CONCAT44(local_198.area,local_198.ymax) - (long)pvVar6);
  }
LAB_00484762:
  if (local_178.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar17;
}

Assistant:

int Yolov3DetectionOutput_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}